

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::FloatBitsToUintIntCase::compare
          (FloatBitsToUintIntCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  uint uVar3;
  ostream *poVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  Hex<8UL> hex_01;
  ulong uVar8;
  uint uVar9;
  
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  uVar7 = ~(-1 << (0x17 - (&DAT_018a99cc)[(ulong)PVar1 * 4] & 0x1f));
  uVar8 = 0;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  do {
    if (uVar6 == uVar8) {
LAB_0127167f:
      return (long)(int)uVar3 <= (long)uVar8;
    }
    uVar5 = *(uint *)((long)*inputs + uVar8 * 4);
    hex.value._4_4_ = 0;
    hex.value._0_4_ = uVar5;
    uVar5 = *(int *)((long)*outputs + uVar8 * 4) - uVar5;
    uVar9 = -uVar5;
    if (0 < (int)uVar5) {
      uVar9 = uVar5;
    }
    if ((int)uVar7 < (int)uVar9) {
      poVar4 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar8);
      poVar4 = std::operator<<(poVar4,"] = ");
      poVar4 = tcu::Format::operator<<(poVar4,hex);
      poVar4 = std::operator<<(poVar4," with threshold ");
      hex_00.value._4_4_ = 0;
      hex_00.value._0_4_ = uVar7;
      poVar4 = tcu::Format::operator<<(poVar4,hex_00);
      poVar4 = std::operator<<(poVar4,", got diff ");
      hex_01.value._4_4_ = 0;
      hex_01.value._0_4_ = uVar9;
      tcu::Format::operator<<(poVar4,hex_01);
      goto LAB_0127167f;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const int				maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const deUint32	out0		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	refOut0		= tcu::Float32(in0).bits();
			const int		ulpDiff		= de::abs((int)out0 - (int)refOut0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(refOut0) << " with threshold "
							<< tcu::toHex(maxUlpDiff) << ", got diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}